

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Act(NPC *this)

{
  byte bVar1;
  byte bVar2;
  pointer ppNVar3;
  NPC *this_00;
  World *pWVar4;
  long lVar5;
  long *plVar6;
  Character *pCVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  ENF_Data *pEVar11;
  mapped_type *pmVar12;
  list<Character_*,_std::allocator<Character_*>_> *plVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  Character *pCVar18;
  _List_node_base *p_Var19;
  int iVar20;
  int iVar21;
  Character *pCVar22;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *plVar23;
  Direction DVar24;
  pointer ppNVar25;
  double dVar26;
  allocator<char> local_75;
  uint local_74;
  double local_70;
  uint local_68;
  uint local_64;
  Character *local_60;
  double local_58;
  key_type local_50;
  
  pEVar11 = ENF(this);
  if ((pEVar11->child != 0) && (this->parent == (NPC *)0x0)) {
    ppNVar25 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppNVar3 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (ppNVar25 == ppNVar3) goto LAB_00160e43;
      this_00 = *ppNVar25;
      pEVar11 = ENF(this_00);
      ppNVar25 = ppNVar25 + 1;
    } while (pEVar11->boss == 0);
    this->parent = this_00;
  }
LAB_00160e43:
  iVar10 = util::rand();
  this->last_act = (double)iVar10 / 1000.0 + this->last_act;
  if (this->spawn_type == '\a') {
    return;
  }
  pWVar4 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"NPCChaseDistance",&local_75);
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar4->config,&local_50);
  local_74 = util::variant::GetInt(pmVar12);
  std::__cxx11::string::~string((string *)&local_50);
  pEVar11 = ENF(this);
  if ((pEVar11->type == Passive) || (pEVar11 = ENF(this), pEVar11->type == Aggressive)) {
    local_60 = (Character *)0x0;
    p_Var19 = (_List_node_base *)&this->damagelist;
    uVar15 = 0;
    uVar14 = local_74;
    pCVar22 = local_60;
    do {
      local_60 = pCVar22;
      local_74 = uVar14;
      uVar17 = uVar15;
      local_64 = local_74 & 0xff;
      local_68 = uVar17 & 0xffff;
      do {
        do {
          do {
            p_Var19 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                         *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var19 == (_List_node_base *)&this->damagelist) {
              pCVar22 = local_60;
              if (this->parent == (NPC *)0x0) goto LAB_00161173;
              plVar23 = &this->parent->damagelist;
              p_Var19 = (_List_node_base *)plVar23;
              uVar15 = local_74;
              goto LAB_00161044;
            }
            lVar5 = *(long *)p_Var19[1]._M_next;
          } while ((*(Map **)(lVar5 + 0x470) != this->map) || (*(char *)(lVar5 + 0xd) != '\0'));
          local_58 = *(double *)((long)p_Var19[1]._M_next + 0x10);
          local_70 = Timer::GetTime();
          pWVar4 = this->map->world;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"NPCBoredTimer",&local_75);
          pmVar12 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar4->config,&local_50);
          dVar26 = util::variant::GetFloat(pmVar12);
          local_70 = local_70 - dVar26;
          std::__cxx11::string::~string((string *)&local_50);
        } while (local_58 < local_70);
        plVar6 = (long *)p_Var19[1]._M_next;
        pCVar22 = (Character *)*plVar6;
        uVar14 = (uint)pCVar22->x - (uint)this->x;
        uVar15 = -uVar14;
        if (0 < (int)uVar14) {
          uVar15 = uVar14;
        }
        uVar16 = (uint)pCVar22->y - (uint)this->y;
        uVar14 = -uVar16;
        if (0 < (int)uVar16) {
          uVar14 = uVar16;
        }
        uVar14 = (uVar14 & 0xff) + (uVar15 & 0xff) + (uint)((uVar14 & 0xff) + (uVar15 & 0xff) == 0);
        if (uVar14 < local_64) {
          uVar15 = *(uint *)(plVar6 + 1);
          break;
        }
      } while ((uVar14 != local_64) ||
              (uVar15 = *(uint *)(plVar6 + 1), (int)*(uint *)(plVar6 + 1) <= (int)local_68));
    } while( true );
  }
  pCVar22 = (Character *)0x0;
LAB_00161173:
  pEVar11 = ENF(this);
  if ((pEVar11->type == Aggressive) ||
     ((this->parent != (NPC *)0x0 && (pCVar22 != (Character *)0x0)))) {
    pWVar4 = this->map->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"NPCChaseDistance",&local_75);
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar4->config,&local_50);
    uVar14 = util::variant::GetInt(pmVar12);
    std::__cxx11::string::~string((string *)&local_50);
    uVar15 = local_74 & 0xff;
    if ((byte)uVar14 <= (byte)local_74) {
      uVar15 = uVar14;
    }
    if (pCVar22 == (Character *)0x0) {
      uVar15 = uVar14;
    }
    plVar13 = &this->map->characters;
    pCVar18 = pCVar22;
    p_Var19 = (_List_node_base *)plVar13;
    while (p_Var19 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var19->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var19 != (_List_node_base *)plVar13) {
      pCVar7 = (Character *)p_Var19[1]._M_next;
      if (((pCVar7->hidden & 4) == 0) && ((pCVar7->nointeract & 4) == 0)) {
        iVar20 = (uint)pCVar7->x - (uint)this->x;
        iVar10 = -iVar20;
        if (0 < iVar20) {
          iVar10 = iVar20;
        }
        iVar21 = (uint)pCVar7->y - (uint)this->y;
        iVar20 = -iVar21;
        if (0 < iVar21) {
          iVar20 = iVar21;
        }
        uVar14 = iVar20 + iVar10 + (uint)(iVar20 + iVar10 == 0);
        uVar15 = uVar15 & 0xff;
        if (uVar14 < uVar15) {
          pCVar18 = pCVar7;
          uVar15 = uVar14;
        }
      }
    }
    if (pCVar18 != (Character *)0x0) {
      pCVar22 = pCVar18;
    }
  }
  if (pCVar22 == (Character *)0x0) {
    if (this->walk_idle_for == 0) {
      iVar10 = util::rand();
      if (iVar10 - 1U < 6) {
        DVar24 = this->direction;
        goto LAB_00161381;
      }
      if (iVar10 - 7U < 3) goto LAB_00161374;
      if (iVar10 != 10) {
        return;
      }
      iVar10 = util::rand();
    }
    else {
      iVar10 = this->walk_idle_for + -1;
    }
    this->walk_idle_for = iVar10;
  }
  else {
    uVar17 = (uint)this->x - (uint)pCVar22->x;
    bVar1 = this->y;
    bVar2 = pCVar22->y;
    uVar14 = (uint)bVar1 - (uint)bVar2;
    uVar15 = -uVar17;
    if (0 < (int)uVar17) {
      uVar15 = uVar17;
    }
    uVar16 = -uVar14;
    if (0 < (int)uVar14) {
      uVar16 = uVar14;
    }
    if (((char)uVar15 != '\x01') || (bVar1 != bVar2)) {
      if ((this->x != pCVar22->x) || ((uVar16 & 0xff) != 1 && bVar1 != bVar2)) {
        cVar8 = (char)((int)uVar17 >> 0x1f);
        DVar24 = cVar8 * -2 + DIRECTION_LEFT;
        if ((uVar15 & 0xff) <= (uVar16 & 0xff)) {
          DVar24 = (-1 < (int)uVar14) * '\x02';
        }
        this->direction = DVar24;
        bVar9 = Walk(this,DVar24);
        if (bVar9) {
          return;
        }
        DVar24 = this->direction;
        if ((DVar24 & ~DIRECTION_UP) == DIRECTION_DOWN) {
          DVar24 = cVar8 * -2 + DIRECTION_LEFT;
          this->direction = DVar24;
        }
        bVar9 = Walk(this,DVar24);
        if (bVar9) {
          return;
        }
LAB_00161374:
        iVar10 = util::rand();
        DVar24 = (Direction)iVar10;
LAB_00161381:
        Walk(this,DVar24);
        return;
      }
    }
    Attack(this,pCVar22);
  }
  return;
LAB_00161044:
  local_60 = pCVar22;
  local_74 = uVar15;
  local_64 = local_74 & 0xff;
  local_68 = uVar17 & 0xffff;
  do {
    do {
      do {
        p_Var19 = (((_List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                     *)&p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        pCVar22 = local_60;
        if (p_Var19 == (_List_node_base *)plVar23) goto LAB_00161173;
        lVar5 = *(long *)p_Var19[1]._M_next;
      } while ((*(Map **)(lVar5 + 0x470) != this->map) || (*(char *)(lVar5 + 0xd) != '\0'));
      local_58 = *(double *)((long)p_Var19[1]._M_next + 0x10);
      local_70 = Timer::GetTime();
      pWVar4 = this->map->world;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"NPCBoredTimer",&local_75);
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar4->config,&local_50);
      dVar26 = util::variant::GetFloat(pmVar12);
      local_70 = local_70 - dVar26;
      std::__cxx11::string::~string((string *)&local_50);
    } while (local_58 < local_70);
    plVar6 = (long *)p_Var19[1]._M_next;
    pCVar22 = (Character *)*plVar6;
    uVar14 = (uint)pCVar22->x - (uint)this->x;
    uVar15 = -uVar14;
    if (0 < (int)uVar14) {
      uVar15 = uVar14;
    }
    uVar17 = (uint)pCVar22->y - (uint)this->y;
    uVar14 = -uVar17;
    if (0 < (int)uVar17) {
      uVar14 = uVar17;
    }
    uVar15 = (uVar14 & 0xff) + (uVar15 & 0xff) + (uint)((uVar14 & 0xff) + (uVar15 & 0xff) == 0);
    if (uVar15 < local_64) {
      uVar17 = *(uint *)(plVar6 + 1);
      break;
    }
  } while ((uVar15 != local_64) || (uVar17 = *(uint *)(plVar6 + 1), (int)uVar17 <= (int)local_68));
  goto LAB_00161044;
}

Assistant:

void NPC::Act()
{
	// Needed for the server startup spawn to work properly
	if (this->ENF().child && !this->parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().boss)
			{
				this->parent = npc;
				break;
			}
		}
	}

	this->last_act += double(util::rand(int(this->act_speed * 750.0), int(this->act_speed * 1250.0))) / 1000.0;

	if (this->spawn_type == 7)
	{
		return;
	}

	Character *attacker = 0;
	unsigned char attacker_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);
	unsigned short attacker_damage = 0;

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
			{
				continue;
			}

			int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
			{
				attacker = opponent->attacker;
				attacker_damage = opponent->damage;
				attacker_distance = distance;
			}
		}

		if (this->parent)
		{
			UTIL_FOREACH_CREF(this->parent->damagelist, opponent)
			{
				if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
				{
					continue;
				}

				int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

				if (distance == 0)
					distance = 1;

				if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
				{
					attacker = opponent->attacker;
					attacker_damage = opponent->damage;
					attacker_distance = distance;
				}
			}
		}
	}

	if (this->ENF().type == ENF::Aggressive || (this->parent && attacker))
	{
		Character *closest = 0;
		unsigned char closest_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);

		if (attacker)
		{
			closest = attacker;
			closest_distance = std::min(closest_distance, attacker_distance);
		}

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->IsHideNpc() || !character->CanInteractCombat())
				continue;

			int distance = util::path_length(character->x, character->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if (distance < closest_distance)
			{
				closest = character;
				closest_distance = distance;
			}
		}

		if (closest)
		{
			attacker = closest;
		}
	}
	
	if (attacker)
	{
		int xdiff = this->x - attacker->x;
		int ydiff = this->y - attacker->y;
		int absxdiff = std::abs(xdiff);
		int absydiff = std::abs(ydiff);

		if ((absxdiff == 1 && absydiff == 0) || (absxdiff == 0 && absydiff == 1) || (absxdiff == 0 && absydiff == 0))
		{
			this->Attack(attacker);
			return;
		}
		else if (absxdiff > absydiff)
		{
			if (xdiff < 0)
			{
				this->direction = DIRECTION_RIGHT;
			}
			else
			{
				this->direction = DIRECTION_LEFT;
			}
		}
		else
		{
			if (ydiff < 0)
			{
				this->direction = DIRECTION_DOWN;
			}
			else
			{
				this->direction = DIRECTION_UP;
			}
		}

		if (this->Walk(this->direction) == Map::WalkFail)
		{
			if (this->direction == DIRECTION_UP || this->direction == DIRECTION_DOWN)
			{
				if (xdiff < 0)
				{
					this->direction = DIRECTION_RIGHT;
				}
				else
				{
					this->direction = DIRECTION_LEFT;
				}
			}

			if (this->Walk(static_cast<Direction>(this->direction)) == Map::WalkFail)
			{
				this->Walk(static_cast<Direction>(util::rand(0,3)));
			}
		}
	}
	else
	{
		// Random walking

		int act;
		if (this->walk_idle_for == 0)
		{
			act = util::rand(1,10);
		}
		else
		{
			--this->walk_idle_for;
			act = 11;
		}

		if (act >= 1 && act <= 6) // 60% chance walk foward
		{
			this->Walk(this->direction);
		}

		if (act >= 7 && act <= 9) // 30% change direction
		{
			this->Walk(static_cast<Direction>(util::rand(0,3)));
		}

		if (act == 10) // 10% take a break
		{
			this->walk_idle_for = util::rand(1,4);
		}
	}
}